

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::gather_modeling_interactive(void)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = true;
LAB_0010a9f3:
  do {
    if (!bVar1) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"What would you like to do?",&local_131);
    print_ln(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70," 1 - Append one 2D geofile to another.",&local_131);
    print_ln(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90," 2 - Merge two geo files.",&local_131);
    print_ln(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0," 3 - Translate entire geo file.",&local_131);
    print_ln(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0," 4 - Rotate entire geo file.",&local_131);
    print_ln(&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0," 5 - Scale entire geo file.",&local_131);
    print_ln(&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    skip_ln();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Please enter a number followed by return:",&local_131);
    print_ln(&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    iVar2 = get_choice();
    switch(iVar2) {
    case 1:
      gather_append_interactive();
      break;
    case 2:
      gather_merge_interactive();
      break;
    case 3:
      gather_translate_interactive();
      break;
    case 4:
      gather_rotate_interactive();
      break;
    case 5:
      gather_scale_interactive();
      break;
    default:
      goto switchD_0010ab59_default;
    }
    bVar1 = false;
  } while( true );
switchD_0010ab59_default:
  clear_screen();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Unrecognized input",&local_131);
  print_ln(&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  goto LAB_0010a9f3;
}

Assistant:

void UI::gather_modeling_interactive()
{
    bool answered = false;
    while (answered == false)
    {
        print_ln("What would you like to do?");
        print_ln(" 1 - Append one 2D geofile to another.");
        print_ln(" 2 - Merge two geo files.");
        print_ln(" 3 - Translate entire geo file.");
        print_ln(" 4 - Rotate entire geo file.");
        print_ln(" 5 - Scale entire geo file.");
        skip_ln();
        print_ln("Please enter a number followed by return:");
        int choice = get_choice();
        switch (choice)
        {
        case 1:
            gather_append_interactive();
            answered = true;
            break;
        case 2:
            gather_merge_interactive();
            answered = true;
            break;
        case 3:
            gather_translate_interactive();
            answered = true;
            break;
        case 4:
            gather_rotate_interactive();
            answered = true;
            break;
        case 5:
            gather_scale_interactive();
            answered = true;
            break;
        default:
            clear_screen();
            print_ln("Unrecognized input");
            break;
        }
    }
}